

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionBody::NeedEnsureDynamicProfileInfo(FunctionBody *this)

{
  bool bVar1;
  
  if ((*(uint *)&this->field_0x178 & 0x20000100) != 0) {
    return false;
  }
  bVar1 = DynamicProfileInfo::IsEnabled(this);
  return bVar1;
}

Assistant:

bool FunctionBody::NeedEnsureDynamicProfileInfo() const
    {
        // Only need to ensure dynamic profile if we don't already have link up the dynamic profile info
        // and dynamic profile collection is enabled
        return
            !this->m_isFromNativeCodeModule &&
            !this->HasExecutionDynamicProfileInfo() &&
            DynamicProfileInfo::IsEnabled(this);
    }